

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O1

string * __thiscall
flatbuffers::Parser::ConformTo_abi_cxx11_(string *__return_storage_ptr__,Parser *this,Parser *base)

{
  SymbolTable<flatbuffers::FieldDef> *this_00;
  key_type *pkVar1;
  size_t sVar2;
  StructDef *pSVar3;
  StructDef *pSVar4;
  EnumDef *pEVar5;
  EnumDef *pEVar6;
  EnumVal *__k;
  size_type sVar7;
  SymbolTable<flatbuffers::FieldDef> *pSVar8;
  string *psVar9;
  FieldDef *pFVar10;
  int iVar11;
  const_iterator cVar12;
  const_iterator cVar13;
  long *plVar14;
  _Base_ptr p_Var15;
  undefined8 *puVar16;
  const_iterator cVar17;
  SymbolTable<flatbuffers::StructDef> *pSVar18;
  const_iterator cVar19;
  long lVar20;
  SymbolTable<flatbuffers::StructDef> *pSVar21;
  ulong uVar22;
  size_type *psVar23;
  long *plVar24;
  _Base_ptr p_Var25;
  _Base_ptr p_Var26;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar27;
  char *pcVar28;
  pointer ppSVar29;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::FieldDef_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::FieldDef_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::FieldDef_*>_>_>
  *this_01;
  uint uVar30;
  bool bVar31;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> qualified_field_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> qualified_field_base;
  FieldDef *field_base;
  string qualified_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  set<flatbuffers::FieldDef_*,_std::less<flatbuffers::FieldDef_*>,_std::allocator<flatbuffers::FieldDef_*>_>
  renamed_fields;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  string *local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  StructDef *local_130;
  FieldDef *local_128;
  string local_120;
  Parser *local_100;
  SymbolTable<flatbuffers::StructDef> *local_f8;
  pointer local_f0;
  long *local_e8;
  long local_e0;
  long local_d8;
  long lStack_d0;
  undefined1 local_c8 [32];
  _Base_ptr local_a8;
  size_t local_a0;
  _Base_ptr local_98;
  Parser *local_90;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::FieldDef_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::FieldDef_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::FieldDef_*>_>_>
  *local_88;
  _Base_ptr local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  ppSVar29 = (this->structs_).vec.
             super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  local_158 = __return_storage_ptr__;
  local_100 = base;
  local_90 = this;
  if (ppSVar29 !=
      (this->structs_).vec.
      super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    local_f8 = &base->structs_;
    local_98 = &(base->structs_).dict._M_t._M_impl.super__Rb_tree_header._M_header;
    local_78 = &__return_storage_ptr__->field_2;
    do {
      p_Var15 = (_Base_ptr)(local_c8 + 8);
      local_130 = *ppSVar29;
      Namespace::GetFullyQualifiedName
                (&local_120,(local_130->super_Definition).defined_namespace,(string *)local_130,1000
                );
      cVar12 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>_>_>
               ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>_>_>
                       *)local_f8,&local_120);
      if (cVar12._M_node == local_98) {
        lVar20 = 0;
      }
      else {
        lVar20 = *(long *)(cVar12._M_node + 2);
      }
      if (lVar20 == 0) {
        uVar30 = 4;
      }
      else {
        *(int *)(lVar20 + 0xb8) = *(int *)(lVar20 + 0xb8) + 1;
        local_c8._8_4_ = _S_red;
        local_c8._16_8_ = (_Base_ptr)0x0;
        local_a0 = 0;
        p_Var25 = *(_Base_ptr *)&((_Rb_tree_header *)&(local_130->fields).vec)->_M_header;
        local_f0 = ppSVar29;
        local_c8._24_8_ = p_Var15;
        local_a8 = p_Var15;
        if (p_Var25 != (((_Rb_tree_header *)&(local_130->fields).vec)->_M_header)._M_parent) {
          this_01 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::FieldDef_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::FieldDef_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::FieldDef_*>_>_>
                     *)(lVar20 + 200);
          local_80 = (_Base_ptr)(lVar20 + 0xd0);
          local_88 = this_01;
          do {
            pkVar1 = *(key_type **)p_Var25;
            cVar13 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::FieldDef_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::FieldDef_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::FieldDef_*>_>_>
                     ::find(this_01,pkVar1);
            if (cVar13._M_node == local_80) {
              local_128 = (FieldDef *)0x0;
            }
            else {
              local_128 = *(FieldDef **)(cVar13._M_node + 2);
            }
            local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_150,local_120._M_dataplus._M_p,
                       local_120._M_dataplus._M_p + local_120._M_string_length);
            std::__cxx11::string::append((char *)&local_150);
            plVar14 = (long *)std::__cxx11::string::_M_append
                                        ((char *)&local_150,(ulong)(pkVar1->_M_dataplus)._M_p);
            local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
            psVar23 = (size_type *)(plVar14 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar14 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar23) {
              local_178.field_2._M_allocated_capacity = *psVar23;
              local_178.field_2._8_8_ = plVar14[3];
            }
            else {
              local_178.field_2._M_allocated_capacity = *psVar23;
              local_178._M_dataplus._M_p = (pointer)*plVar14;
            }
            local_178._M_string_length = plVar14[1];
            *plVar14 = (long)psVar23;
            plVar14[1] = 0;
            *(undefined1 *)(plVar14 + 2) = 0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_150._M_dataplus._M_p != &local_150.field_2) {
              operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1
                             );
            }
            pFVar10 = local_128;
            if (local_128 == (FieldDef *)0x0) {
              plVar14 = *(long **)(lVar20 + 0xf8);
              uVar30 = 8;
              bVar31 = true;
              if (plVar14 != *(long **)(lVar20 + 0x100)) {
                do {
                  local_128 = (FieldDef *)*plVar14;
                  if ((voffset_t)pkVar1[8]._M_string_length == (local_128->value).offset) {
                    std::
                    _Rb_tree<flatbuffers::FieldDef*,flatbuffers::FieldDef*,std::_Identity<flatbuffers::FieldDef*>,std::less<flatbuffers::FieldDef*>,std::allocator<flatbuffers::FieldDef*>>
                    ::_M_insert_unique<flatbuffers::FieldDef*const&>
                              ((_Rb_tree<flatbuffers::FieldDef*,flatbuffers::FieldDef*,std::_Identity<flatbuffers::FieldDef*>,std::less<flatbuffers::FieldDef*>,std::allocator<flatbuffers::FieldDef*>>
                                *)local_c8,&local_128);
                    pFVar10 = local_128;
                    if (((BaseType)pkVar1[6]._M_string_length == (local_128->value).type.base_type)
                       && (*(BaseType *)((long)&pkVar1[6]._M_string_length + 4) ==
                           (local_128->value).type.element)) {
                      pSVar3 = (StructDef *)pkVar1[6].field_2._M_allocated_capacity;
                      pSVar4 = (local_128->value).type.struct_def;
                      if ((pSVar3 == pSVar4) ||
                         (((pSVar4 != (StructDef *)0x0 && pSVar3 != (StructDef *)0x0 &&
                           (sVar2 = (pSVar3->super_Definition).name._M_string_length,
                           sVar2 == (pSVar4->super_Definition).name._M_string_length)) &&
                          ((sVar2 == 0 ||
                           (iVar11 = bcmp((pSVar3->super_Definition).name._M_dataplus._M_p,
                                          (pSVar4->super_Definition).name._M_dataplus._M_p,sVar2),
                           iVar11 == 0)))))) {
                        pEVar5 = *(EnumDef **)((long)&pkVar1[6].field_2 + 8);
                        pEVar6 = (pFVar10->value).type.enum_def;
                        if ((pEVar5 == pEVar6) ||
                           (((pEVar6 != (EnumDef *)0x0 && pEVar5 != (EnumDef *)0x0 &&
                             (sVar2 = (pEVar5->super_Definition).name._M_string_length,
                             sVar2 == (pEVar6->super_Definition).name._M_string_length)) &&
                            ((sVar2 == 0 ||
                             (iVar11 = bcmp((pEVar5->super_Definition).name._M_dataplus._M_p,
                                            (pEVar6->super_Definition).name._M_dataplus._M_p,sVar2),
                             iVar11 == 0)))))) break;
                      }
                    }
                    local_e8 = &local_d8;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_e8,local_120._M_dataplus._M_p,
                               local_120._M_dataplus._M_p + local_120._M_string_length);
                    std::__cxx11::string::append((char *)&local_e8);
                    plVar14 = (long *)std::__cxx11::string::_M_append
                                                ((char *)&local_e8,
                                                 (ulong)(local_128->super_Definition).name.
                                                        _M_dataplus._M_p);
                    psVar9 = local_158;
                    psVar23 = (size_type *)(plVar14 + 2);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*plVar14 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)psVar23) {
                      local_150.field_2._M_allocated_capacity = *psVar23;
                      local_150.field_2._8_8_ = plVar14[3];
                      local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
                    }
                    else {
                      local_150.field_2._M_allocated_capacity = *psVar23;
                      local_150._M_dataplus._M_p = (pointer)*plVar14;
                    }
                    local_150._M_string_length = plVar14[1];
                    *plVar14 = (long)psVar23;
                    plVar14[1] = 0;
                    *(undefined1 *)(plVar14 + 2) = 0;
                    if (local_e8 != &local_d8) {
                      operator_delete(local_e8,local_d8 + 1);
                    }
                    std::operator+(&local_50,"field renamed to different type: ",&local_178);
                    plVar14 = (long *)std::__cxx11::string::append((char *)&local_50);
                    local_70 = &local_60;
                    plVar24 = plVar14 + 2;
                    if ((long *)*plVar14 == plVar24) {
                      local_60 = *plVar24;
                      lStack_58 = plVar14[3];
                    }
                    else {
                      local_60 = *plVar24;
                      local_70 = (long *)*plVar14;
                    }
                    local_68 = plVar14[1];
                    *plVar14 = (long)plVar24;
                    plVar14[1] = 0;
                    *(undefined1 *)(plVar14 + 2) = 0;
                    plVar14 = (long *)std::__cxx11::string::_M_append
                                                ((char *)&local_70,(ulong)local_150._M_dataplus._M_p
                                                );
                    plVar24 = plVar14 + 2;
                    if ((long *)*plVar14 == plVar24) {
                      local_d8 = *plVar24;
                      lStack_d0 = plVar14[3];
                      local_e8 = &local_d8;
                    }
                    else {
                      local_d8 = *plVar24;
                      local_e8 = (long *)*plVar14;
                    }
                    local_e0 = plVar14[1];
                    *plVar14 = (long)plVar24;
                    plVar14[1] = 0;
                    *(undefined1 *)(plVar14 + 2) = 0;
                    plVar14 = (long *)std::__cxx11::string::append((char *)&local_e8);
                    (psVar9->_M_dataplus)._M_p = (pointer)local_78;
                    psVar23 = (size_type *)(plVar14 + 2);
                    if ((size_type *)*plVar14 == psVar23) {
                      sVar7 = plVar14[3];
                      local_78->_M_allocated_capacity = *psVar23;
                      *(size_type *)((long)local_78 + 8) = sVar7;
                    }
                    else {
                      (psVar9->_M_dataplus)._M_p = (pointer)*plVar14;
                      (psVar9->field_2)._M_allocated_capacity = *psVar23;
                    }
                    psVar9->_M_string_length = plVar14[1];
                    *plVar14 = (long)psVar23;
                    plVar14[1] = 0;
                    *(undefined1 *)(plVar14 + 2) = 0;
                    if (local_e8 != &local_d8) {
                      operator_delete(local_e8,local_d8 + 1);
                    }
                    if (local_70 != &local_60) {
                      operator_delete(local_70,local_60 + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_50._M_dataplus._M_p != &local_50.field_2) {
                      operator_delete(local_50._M_dataplus._M_p,
                                      local_50.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_150._M_dataplus._M_p != &local_150.field_2) {
                      operator_delete(local_150._M_dataplus._M_p,
                                      local_150.field_2._M_allocated_capacity + 1);
                    }
                    uVar30 = 1;
                    bVar31 = false;
                    break;
                  }
                  plVar14 = plVar14 + 1;
                } while (plVar14 != *(long **)(lVar20 + 0x100));
              }
              this_01 = local_88;
              if (bVar31) {
LAB_001277cd:
                uVar30 = 0;
              }
            }
            else {
              pcVar28 = "offsets differ for field: ";
              if ((voffset_t)pkVar1[8]._M_string_length == (local_128->value).offset) {
                sVar2 = pkVar1[7].field_2._M_allocated_capacity;
                pcVar28 = "defaults differ for field: ";
                if (sVar2 == (local_128->value).constant._M_string_length) {
                  if (sVar2 != 0) {
                    iVar11 = bcmp((void *)pkVar1[7]._M_string_length,
                                  (local_128->value).constant._M_dataplus._M_p,sVar2);
                    pcVar28 = "defaults differ for field: ";
                    if (iVar11 != 0) goto LAB_0012740a;
                  }
                  pcVar28 = "types differ for field: ";
                  if (((BaseType)pkVar1[6]._M_string_length == (pFVar10->value).type.base_type) &&
                     (pcVar28 = "types differ for field: ",
                     *(BaseType *)((long)&pkVar1[6]._M_string_length + 4) ==
                     (pFVar10->value).type.element)) {
                    pSVar3 = (StructDef *)pkVar1[6].field_2._M_allocated_capacity;
                    pSVar4 = (pFVar10->value).type.struct_def;
                    if (pSVar3 == pSVar4) goto LAB_00127395;
                    pcVar28 = "types differ for field: ";
                    if (pSVar4 != (StructDef *)0x0 && pSVar3 != (StructDef *)0x0) {
                      sVar2 = (pSVar3->super_Definition).name._M_string_length;
                      pcVar28 = "types differ for field: ";
                      if (sVar2 == (pSVar4->super_Definition).name._M_string_length) {
                        if (sVar2 != 0) {
                          iVar11 = bcmp((pSVar3->super_Definition).name._M_dataplus._M_p,
                                        (pSVar4->super_Definition).name._M_dataplus._M_p,sVar2);
                          pcVar28 = "types differ for field: ";
                          if (iVar11 != 0) goto LAB_0012740a;
                        }
LAB_00127395:
                        pEVar5 = *(EnumDef **)((long)&pkVar1[6].field_2 + 8);
                        pEVar6 = (pFVar10->value).type.enum_def;
                        if (pEVar5 == pEVar6) goto LAB_001273ee;
                        pcVar28 = "types differ for field: ";
                        if (pEVar6 != (EnumDef *)0x0 && pEVar5 != (EnumDef *)0x0) {
                          sVar2 = (pEVar5->super_Definition).name._M_string_length;
                          pcVar28 = "types differ for field: ";
                          if (sVar2 == (pEVar6->super_Definition).name._M_string_length) {
                            if (sVar2 != 0) {
                              iVar11 = bcmp((pEVar5->super_Definition).name._M_dataplus._M_p,
                                            (pEVar6->super_Definition).name._M_dataplus._M_p,sVar2);
                              pcVar28 = "types differ for field: ";
                              if (iVar11 != 0) goto LAB_0012740a;
                            }
LAB_001273ee:
                            pcVar28 = "offset types differ for field: ";
                            if ((bool)pkVar1[8].field_2._M_local_buf[5] == pFVar10->offset64)
                            goto LAB_001277cd;
                          }
                        }
                      }
                    }
                  }
                }
              }
LAB_0012740a:
              uVar30 = 1;
              std::operator+(local_158,pcVar28,&local_178);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_178._M_dataplus._M_p != &local_178.field_2) {
              operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1
                             );
            }
            if (uVar30 != 0) goto LAB_0012780c;
            p_Var25 = (_Base_ptr)&p_Var25->_M_parent;
          } while (p_Var25 != (((_Rb_tree_header *)&(local_130->fields).vec)->_M_header)._M_parent);
        }
        uVar30 = 5;
LAB_0012780c:
        if (uVar30 == 5) {
          puVar16 = *(undefined8 **)(lVar20 + 0xf8);
          uVar30 = 0;
          if (puVar16 != *(undefined8 **)(lVar20 + 0x100)) {
            this_00 = &local_130->fields;
            pSVar8 = &local_130->fields;
            do {
              pkVar1 = (key_type *)*puVar16;
              p_Var15 = (_Base_ptr)(local_c8 + 8);
              for (p_Var25 = (_Base_ptr)local_c8._16_8_; p_Var25 != (_Base_ptr)0x0;
                  p_Var25 = (&p_Var25->_M_left)[*(key_type **)(p_Var25 + 1) < pkVar1]) {
                if (*(key_type **)(p_Var25 + 1) >= pkVar1) {
                  p_Var15 = p_Var25;
                }
              }
              p_Var25 = (_Base_ptr)(local_c8 + 8);
              p_Var26 = p_Var25;
              if ((p_Var15 != p_Var25) && (p_Var26 = p_Var15, pkVar1 < *(key_type **)(p_Var15 + 1)))
              {
                p_Var26 = p_Var25;
              }
              if ((p_Var26 == p_Var25) &&
                 ((cVar13 = std::
                            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::FieldDef_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::FieldDef_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::FieldDef_*>_>_>
                            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::FieldDef_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::FieldDef_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::FieldDef_*>_>_>
                                    *)this_00,pkVar1),
                  (_Rb_tree_header *)cVar13._M_node ==
                  &(pSVar8->dict)._M_t._M_impl.super__Rb_tree_header ||
                  (*(long *)(cVar13._M_node + 2) == 0)))) {
                std::operator+(&local_150,"field deleted: ",&local_120);
                plVar14 = (long *)std::__cxx11::string::append((char *)&local_150);
                psVar9 = local_158;
                local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
                psVar23 = (size_type *)(plVar14 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar14 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar23) {
                  local_178.field_2._M_allocated_capacity = *psVar23;
                  local_178.field_2._8_8_ = plVar14[3];
                }
                else {
                  local_178.field_2._M_allocated_capacity = *psVar23;
                  local_178._M_dataplus._M_p = (pointer)*plVar14;
                }
                local_178._M_string_length = plVar14[1];
                *plVar14 = (long)psVar23;
                plVar14[1] = 0;
                *(undefined1 *)(plVar14 + 2) = 0;
                puVar16 = (undefined8 *)
                          std::__cxx11::string::_M_append
                                    ((char *)&local_178,(ulong)(pkVar1->_M_dataplus)._M_p);
                (psVar9->_M_dataplus)._M_p = (pointer)local_78;
                psVar23 = puVar16 + 2;
                if ((size_type *)*puVar16 == psVar23) {
                  sVar7 = puVar16[3];
                  local_78->_M_allocated_capacity = *psVar23;
                  *(size_type *)((long)local_78 + 8) = sVar7;
                }
                else {
                  (psVar9->_M_dataplus)._M_p = (pointer)*puVar16;
                  (psVar9->field_2)._M_allocated_capacity = *psVar23;
                }
                psVar9->_M_string_length = puVar16[1];
                *puVar16 = psVar23;
                puVar16[1] = 0;
                *(undefined1 *)(puVar16 + 2) = 0;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_178._M_dataplus._M_p != &local_178.field_2) {
                  operator_delete(local_178._M_dataplus._M_p,
                                  local_178.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_150._M_dataplus._M_p != &local_150.field_2) {
                  operator_delete(local_150._M_dataplus._M_p,
                                  local_150.field_2._M_allocated_capacity + 1);
                }
                uVar30 = 1;
                break;
              }
              puVar16 = puVar16 + 1;
            } while (puVar16 != *(undefined8 **)(lVar20 + 0x100));
          }
        }
        std::
        _Rb_tree<flatbuffers::FieldDef_*,_flatbuffers::FieldDef_*,_std::_Identity<flatbuffers::FieldDef_*>,_std::less<flatbuffers::FieldDef_*>,_std::allocator<flatbuffers::FieldDef_*>_>
        ::~_Rb_tree((_Rb_tree<flatbuffers::FieldDef_*,_flatbuffers::FieldDef_*,_std::_Identity<flatbuffers::FieldDef_*>,_std::less<flatbuffers::FieldDef_*>,_std::allocator<flatbuffers::FieldDef_*>_>
                     *)local_c8);
        ppSVar29 = local_f0;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._M_dataplus._M_p != &local_120.field_2) {
        operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
      }
      if ((uVar30 & 0xb) != 0) goto LAB_00127a1f;
      ppSVar29 = ppSVar29 + 1;
    } while (ppSVar29 !=
             (local_90->structs_).vec.
             super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>
             ._M_impl.super__Vector_impl_data._M_finish);
    uVar30 = 2;
LAB_00127a1f:
    if (uVar30 != 2) {
      return local_158;
    }
  }
  ppSVar29 = (pointer)(local_90->enums_).vec.
                      super__Vector_base<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>
                      ._M_impl.super__Vector_impl_data._M_start;
  bVar31 = ppSVar29 ==
           (pointer)(local_90->enums_).vec.
                    super__Vector_base<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
  if (!bVar31) {
    local_80 = (_Base_ptr)&local_100->enums_;
    local_100 = (Parser *)&(local_100->enums_).dict._M_t._M_impl.super__Rb_tree_header;
    local_98 = (_Base_ptr)&local_158->field_2;
    do {
      local_88 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::FieldDef_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::FieldDef_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::FieldDef_*>_>_>
                  *)CONCAT71(local_88._1_7_,bVar31);
      pSVar3 = *ppSVar29;
      Namespace::GetFullyQualifiedName
                ((string *)local_c8,(pSVar3->super_Definition).defined_namespace,(string *)pSVar3,
                 1000);
      cVar17 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumDef_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumDef_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumDef_*>_>_>
               ::find(local_80,(string *)local_c8);
      if ((Parser *)cVar17._M_node == local_100) {
        pSVar18 = (SymbolTable<flatbuffers::StructDef> *)0x0;
      }
      else {
        pSVar18 = *(SymbolTable<flatbuffers::StructDef> **)(cVar17._M_node + 2);
      }
      if (pSVar18 == (SymbolTable<flatbuffers::StructDef> *)0x0) {
        uVar30 = 0;
      }
      else {
        pbVar27 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (((vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_> *)
                   &pSVar3->bytesize)->
                  super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        local_130 = (StructDef *)CONCAT44(local_130._4_4_,0x11);
        bVar31 = pbVar27 ==
                 (pSVar3->original_location)._M_t.
                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl;
        pSVar21 = pSVar18;
        if (!bVar31) {
          local_f8 = pSVar18;
          local_f0 = ppSVar29;
          do {
            __k = (EnumVal *)(pbVar27->_M_dataplus)._M_p;
            cVar19 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumVal_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumVal_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumVal_*>_>_>
                     ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumVal_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumVal_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumVal_*>_>_>
                             *)((vector<flatbuffers::Namespace_*,_std::allocator<flatbuffers::Namespace_*>_>
                                 *)(pSVar18 + 3) + 1),(key_type *)__k);
            if (cVar19._M_node ==
                (_Base_ptr)
                ((long)((vector<flatbuffers::Namespace_*,_std::allocator<flatbuffers::Namespace_*>_>
                         *)(pSVar18 + 3) + 1) + 8)) {
              lVar20 = 0;
            }
            else {
              lVar20 = *(long *)(cVar19._M_node + 2);
            }
            if ((lVar20 != 0) && (__k->value != *(long *)(lVar20 + 0xa0))) {
              local_130 = (StructDef *)CONCAT44(local_130._4_4_,1);
              std::operator+(local_158,"values differ for enum: ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             __k);
              pSVar21 = local_f8;
              ppSVar29 = local_f0;
              break;
            }
            pbVar27 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &pbVar27->_M_string_length;
            bVar31 = pbVar27 ==
                     (pSVar3->original_location)._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl;
            pSVar21 = local_f8;
            ppSVar29 = local_f0;
          } while (!bVar31);
        }
        uVar30 = (uint)local_130;
        if ((bVar31) &&
           (uVar30 = 0,
           *(_Rb_tree_color *)
            &(((SymbolTable<flatbuffers::ServiceDef> *)(pSVar21 + 2))->vec).
             super__Vector_base<flatbuffers::ServiceDef_*,_std::allocator<flatbuffers::ServiceDef_*>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage !=
           (pSVar3->fields).dict._M_t._M_impl.super__Rb_tree_header._M_header._M_color)) {
          uVar22 = (ulong)*(bool *)&(pSVar3->fields).dict._M_t._M_impl;
          pcVar28 = "enum: ";
          if (uVar22 != 0) {
            pcVar28 = "union: ";
          }
          local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_178,pcVar28,pcVar28 + uVar22 + 6);
          plVar14 = (long *)std::__cxx11::string::replace((ulong)&local_178,0,(char *)0x0,0x1b78e1);
          psVar9 = local_158;
          psVar23 = (size_type *)(plVar14 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar14 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar23) {
            local_120.field_2._M_allocated_capacity = *psVar23;
            local_120.field_2._8_8_ = plVar14[3];
            local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
          }
          else {
            local_120.field_2._M_allocated_capacity = *psVar23;
            local_120._M_dataplus._M_p = (pointer)*plVar14;
          }
          local_120._M_string_length = plVar14[1];
          *plVar14 = (long)psVar23;
          plVar14[1] = 0;
          *(undefined1 *)(plVar14 + 2) = 0;
          plVar14 = (long *)std::__cxx11::string::_M_append((char *)&local_120,local_c8._0_8_);
          (psVar9->_M_dataplus)._M_p = (pointer)local_98;
          psVar23 = (size_type *)(plVar14 + 2);
          if ((size_type *)*plVar14 == psVar23) {
            p_Var15 = (_Base_ptr)plVar14[3];
            *(size_type *)local_98 = *psVar23;
            local_98->_M_parent = p_Var15;
          }
          else {
            (psVar9->_M_dataplus)._M_p = (pointer)*plVar14;
            (psVar9->field_2)._M_allocated_capacity = *psVar23;
          }
          psVar9->_M_string_length = plVar14[1];
          *plVar14 = (long)psVar23;
          plVar14[1] = 0;
          *(undefined1 *)(plVar14 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_120._M_dataplus._M_p != &local_120.field_2) {
            operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_178._M_dataplus._M_p != &local_178.field_2) {
            operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
          }
          uVar30 = 1;
        }
      }
      if ((undefined1 *)local_c8._0_8_ != local_c8 + 0x10) {
        operator_delete((void *)local_c8._0_8_,(ulong)(local_c8._16_8_ + 1));
      }
      if ((uVar30 & 0xf) != 0) {
        if (((ulong)local_88 & 1) == 0) {
          return local_158;
        }
        break;
      }
      ppSVar29 = ppSVar29 + 1;
      bVar31 = ppSVar29 ==
               (pointer)(local_90->enums_).vec.
                        super__Vector_base<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
    } while (!bVar31);
  }
  psVar9 = local_158;
  (local_158->_M_dataplus)._M_p = (pointer)&local_158->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"");
  return psVar9;
}

Assistant:

std::string Parser::ConformTo(const Parser &base) {
  for (auto sit = structs_.vec.begin(); sit != structs_.vec.end(); ++sit) {
    auto &struct_def = **sit;
    auto qualified_name =
        struct_def.defined_namespace->GetFullyQualifiedName(struct_def.name);
    auto struct_def_base = base.LookupStruct(qualified_name);
    if (!struct_def_base) continue;
    std::set<FieldDef *> renamed_fields;
    for (auto fit = struct_def.fields.vec.begin();
         fit != struct_def.fields.vec.end(); ++fit) {
      auto &field = **fit;
      auto field_base = struct_def_base->fields.Lookup(field.name);
      const auto qualified_field_name = qualified_name + "." + field.name;
      if (field_base) {
        if (field.value.offset != field_base->value.offset) {
          return "offsets differ for field: " + qualified_field_name;
        }
        if (field.value.constant != field_base->value.constant) {
          return "defaults differ for field: " + qualified_field_name;
        }
        if (!EqualByName(field.value.type, field_base->value.type)) {
          return "types differ for field: " + qualified_field_name;
        }
        if (field.offset64 != field_base->offset64) {
          return "offset types differ for field: " + qualified_field_name;
        }
      } else {
        // Doesn't have to exist, deleting fields is fine.
        // But we should check if there is a field that has the same offset
        // but is incompatible (in the case of field renaming).
        for (auto fbit = struct_def_base->fields.vec.begin();
             fbit != struct_def_base->fields.vec.end(); ++fbit) {
          field_base = *fbit;
          if (field.value.offset == field_base->value.offset) {
            renamed_fields.insert(field_base);
            if (!EqualByName(field.value.type, field_base->value.type)) {
              const auto qualified_field_base =
                  qualified_name + "." + field_base->name;
              return "field renamed to different type: " +
                     qualified_field_name + " (renamed from " +
                     qualified_field_base + ")";
            }
            break;
          }
        }
      }
    }
    // deletion of trailing fields are not allowed
    for (auto fit = struct_def_base->fields.vec.begin();
         fit != struct_def_base->fields.vec.end(); ++fit) {
      auto &field_base = **fit;
      // not a renamed field
      if (renamed_fields.find(&field_base) == renamed_fields.end()) {
        auto field = struct_def.fields.Lookup(field_base.name);
        if (!field) {
          return "field deleted: " + qualified_name + "." + field_base.name;
        }
      }
    }
  }

  for (auto eit = enums_.vec.begin(); eit != enums_.vec.end(); ++eit) {
    auto &enum_def = **eit;
    auto qualified_name =
        enum_def.defined_namespace->GetFullyQualifiedName(enum_def.name);
    auto enum_def_base = base.enums_.Lookup(qualified_name);
    if (!enum_def_base) continue;
    for (auto evit = enum_def.Vals().begin(); evit != enum_def.Vals().end();
         ++evit) {
      auto &enum_val = **evit;
      auto enum_val_base = enum_def_base->Lookup(enum_val.name);
      if (enum_val_base) {
        if (enum_val != *enum_val_base)
          return "values differ for enum: " + enum_val.name;
      }
    }
    // Check underlying type changes
    if (enum_def_base->underlying_type.base_type != enum_def.underlying_type.base_type) {
      return "underlying type differ for " + std::string(enum_def.is_union ? "union: " : "enum: ") + qualified_name;
    }
  }
  return "";
}